

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

void __thiscall ast::StringLiteral::StringLiteral(StringLiteral *this,Token *t,int line)

{
  pointer pcVar1;
  
  (this->super_Expr).super_Node.lineno = line;
  (this->super_Expr).super_Node.type_value = StringLiteralType;
  (this->super_Expr).super_Node._vptr_Node = (_func_int **)&PTR__StringLiteral_00125168;
  (this->tok)._vptr_Token = (_func_int **)&PTR__Token_001258b0;
  (this->tok).Type = t->Type;
  (this->tok).Literal._M_dataplus._M_p = (pointer)&(this->tok).Literal.field_2;
  pcVar1 = (t->Literal)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->tok).Literal,pcVar1,pcVar1 + (t->Literal)._M_string_length);
  (this->Literal)._M_dataplus._M_p = (pointer)&(this->Literal).field_2;
  pcVar1 = (t->Literal)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Literal,pcVar1,pcVar1 + (t->Literal)._M_string_length);
  return;
}

Assistant:

StringLiteral(Token t, int line)
        :Expr(line, NodeType::StringLiteralType), tok{t}, Literal{t.Literal}{}